

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O0

void adt_str_create(adt_str_t *self)

{
  adt_str_t *self_local;
  
  if (self != (adt_str_t *)0x0) {
    self->s32Cur = 0;
    self->s32Size = 0;
    self->pAlloc = (uint8_t *)0x0;
    self->lastError = '\0';
    self->encoding = '\x01';
  }
  return;
}

Assistant:

void adt_str_create(adt_str_t *self)
{
   if(self)
   {
      self->s32Cur = 0;
      self->s32Size = 0;
      self->pAlloc = (uint8_t*) 0;
      self->lastError = ADT_NO_ERROR;
      self->encoding = ADT_STR_ENCODING_ASCII;
   }
}